

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

CPT * __thiscall despot::TabularCPT::CreateNoisyVariant(TabularCPT *this,double noise)

{
  NamedVar *child;
  uint uVar1;
  uint uVar2;
  TabularCPT *this_00;
  int c;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  ulong uVar6;
  double extraout_XMM0_Qa;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_48;
  
  uVar1 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  uVar2 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_48,
             &(this->super_CPT).super_Function.parents_);
  TabularCPT(this_00,child,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_48);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_48);
  std::
  vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ::clear(&(this_00->super_CPT).super_Function.map_);
  this_01 = &(this_00->super_CPT).super_Function.values_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_01,(long)(int)uVar1);
  uVar3 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 * 0x18 - uVar3 != 0; uVar3 = uVar3 + 0x18) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_01->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar3),(long)(int)uVar2);
  }
  uVar5 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar5;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      (*(this->super_CPT).super_Function._vptr_Function[4])
                (this,uVar5 & 0xffffffff,uVar4 & 0xffffffff);
      *(double *)
       (*(long *)&(this_01->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar5].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar4 * 8) =
           (extraout_XMM0_Qa + noise / (double)(int)uVar2) / (noise + 1.0);
    }
  }
  return &this_00->super_CPT;
}

Assistant:

CPT* TabularCPT::CreateNoisyVariant(double noise) const {
	int parent_size = ParentSize(), child_size = ChildSize();

	TabularCPT* cpt = new TabularCPT(child_, parents_);
	cpt->map_.clear();

	cpt->values_.resize(parent_size);
	for (int i = 0; i < parent_size; i++)
		cpt->values_[i].resize(child_size);

	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			cpt->values_[p][c] = (GetValue(p, c) + noise / child_size)
				/ (1 + noise);
		}
	}

	return cpt;
}